

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.H
# Opt level: O0

int __thiscall
amrex::ParmParse::queryAdd<double>
          (ParmParse *this,char *name,vector<double,_std::allocator<double>_> *ref)

{
  bool bVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  int exist;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  char *in_stack_00000048;
  ParmParse *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  vector<double,_std::allocator<double>_> *in_stack_00000060;
  char *in_stack_00000068;
  ParmParse *in_stack_00000070;
  
  iVar2 = queryarr(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
                   in_stack_00000058);
  if (iVar2 == 0) {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_RSI);
    if (!bVar1) {
      addarr(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    }
  }
  return iVar2;
}

Assistant:

int queryAdd (const char* name, std::vector<T>& ref) {
        int exist = this->queryarr(name, ref);
        if (!exist && !ref.empty()) {
            this->addarr(name, ref);
        }
        return exist;
    }